

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

string * __thiscall
cs_impl::any::holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_>::to_string
          (string *__return_storage_ptr__,
          holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_> *this)

{
  list<cs_impl::any,_std::allocator<cs_impl::any>_> *plVar1;
  _List_node_base *p_Var2;
  string str;
  _Alloc_hider local_90;
  size_type local_88;
  char local_80;
  undefined7 uStack_7f;
  undefined8 uStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  plVar1 = &this->mDat;
  if ((this->mDat).super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl._M_node.
      super__List_node_base._M_next == (_List_node_base *)plVar1) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"list => {}",(allocator *)&local_90);
  }
  else {
    std::__cxx11::string::string((string *)&local_90,"list => {",(allocator *)&local_50);
    p_Var2 = (_List_node_base *)plVar1;
    while (p_Var2 = (((_List_base<cs_impl::any,_std::allocator<cs_impl::any>_> *)&p_Var2->_M_next)->
                    _M_impl)._M_node.super__List_node_base._M_next,
          p_Var2 != (_List_node_base *)plVar1) {
      any::to_string_abi_cxx11_(&local_70,(any *)(p_Var2 + 1));
      std::operator+(&local_50,&local_70,", ");
      std::__cxx11::string::append((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::__cxx11::string::resize((ulong)&local_90);
    std::__cxx11::string::append((char *)&local_90);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_90._M_p == &local_80) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_7f,local_80);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_78;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_90._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_7f,local_80);
    }
    __return_storage_ptr__->_M_string_length = local_88;
    local_88 = 0;
    local_80 = '\0';
    local_90._M_p = &local_80;
    std::__cxx11::string::~string((string *)&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const override
			{
				return cs_impl::to_string(mDat);
			}